

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetIntConst
          (ConstantManager *this,uint64_t val,int32_t bitWidth,bool isSigned)

{
  TypeManager *this_00;
  Type *type;
  Constant *pCVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  uint64_t uVar3;
  uint64_t local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = IRContext::get_type_mgr(this->ctx_);
  type = TypeManager::GetIntType(this_00,bitWidth,isSigned);
  if ((int)CONCAT71(in_register_00000009,isSigned) == 0) {
    uVar3 = val;
    if (0x3f < bitWidth) goto LAB_001c4e72;
    uVar3 = val & ~(-1L << ((byte)bitWidth & 0x3f));
  }
  else {
    bVar2 = -(byte)bitWidth;
    uVar3 = (long)(val << (bVar2 & 0x3f)) >> (bVar2 & 0x3f);
  }
  if (bitWidth < 0x21) {
    local_50 = CONCAT44(local_50._4_4_,(int)uVar3);
    uVar3 = local_50;
  }
LAB_001c4e72:
  local_50 = uVar3;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_initialize<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,&local_50);
  pCVar1 = GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  return pCVar1;
}

Assistant:

const Constant* ConstantManager::GetIntConst(uint64_t val, int32_t bitWidth,
                                             bool isSigned) {
  Type* int_type = context()->get_type_mgr()->GetIntType(bitWidth, isSigned);

  if (isSigned) {
    // Sign extend the value.
    int32_t num_of_bit_to_ignore = 64 - bitWidth;
    val = static_cast<int64_t>(val << num_of_bit_to_ignore) >>
          num_of_bit_to_ignore;
  } else if (bitWidth < 64) {
    // Clear the upper bit that are not used.
    uint64_t mask = ((1ull << bitWidth) - 1);
    val &= mask;
  }

  if (bitWidth <= 32) {
    return GetConstant(int_type, {static_cast<uint32_t>(val)});
  }

  // If the value is more than 32-bit, we need to split the operands into two
  // 32-bit integers.
  return GetConstant(
      int_type, {static_cast<uint32_t>(val), static_cast<uint32_t>(val >> 32)});
}